

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void write_cb(uv_write_t *req,int status)

{
  void *pvVar1;
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  uv_shutdown_t *puVar2;
  
  if (req == (uv_write_t *)0x0) {
    write_cb_cold_2();
  }
  else if (status == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  puVar2 = (uv_shutdown_t *)(ulong)(uint)status;
  write_cb_cold_1();
  if (puVar2 == &shutdown_req) {
    if (status != 0) goto LAB_0017517a;
    if ((shutdown_req.handle)->write_queue_size == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      if (write_cb_called == 3) {
        return;
      }
      goto LAB_00175184;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_0017517a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_00175184:
  shutdown_cb_cold_4();
  pvVar1 = malloc(CONCAT44(in_register_00000034,status));
  *extraout_RDX = pvVar1;
  extraout_RDX[1] = CONCAT44(in_register_00000034,status);
  return;
}

Assistant:

static void write_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &write_req);
  ASSERT(req->fs_type == UV_FS_WRITE);
  ASSERT(req->result >= 0);  /* FIXME(bnoordhuis) Check if requested size? */
  write_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_fdatasync(loop, &fdatasync_req, open_req1.result, fdatasync_cb);
  ASSERT(r == 0);
}